

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

anon_class_16_2_560cd874
cppwinrt::bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>
          (string_view *delimiter,
          pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *list)

{
  anon_class_16_2_560cd874 aVar1;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *list_local;
  string_view *delimiter_local;
  
  aVar1.delimiter = delimiter;
  aVar1.list = (pair<winmd::reader::Field,_winmd::reader::Field> *)list;
  return aVar1;
}

Assistant:

auto bind_list(std::string_view const& delimiter, T const& list)
    {
        return [&](auto& writer)
        {
            bool first = true;

            for (auto&& item : list)
            {
                if (first)
                {
                    first = false;
                }
                else
                {
                    writer.write(delimiter);
                }

                writer.write(item);
            }
        };
    }